

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa.c
# Opt level: O2

exr_result_t
internal_exr_undo_dwab
          (exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
          void *uncompressed_data,uint64_t uncompressed_size)

{
  exr_result_t eVar1;
  uint64_t newsz;
  DwaCompressor dwab;
  
  newsz = internal_exr_huf_decompress_spare_bytes();
  eVar1 = internal_decode_alloc_buffer
                    (decode,EXR_TRANSCODE_BUFFER_SCRATCH1,&decode->scratch_buffer_1,
                     &decode->scratch_alloc_size_1,newsz);
  if (eVar1 == 0) {
    eVar1 = DwaCompressor_construct(&dwab,STATIC_HUFFMAN,(exr_encode_pipeline_t *)0x0,decode);
    if (eVar1 == 0) {
      eVar1 = DwaCompressor_uncompress
                        (&dwab,(uint8_t *)compressed_data,comp_buf_size,uncompressed_data,
                         uncompressed_size);
    }
    DwaCompressor_destroy(&dwab);
  }
  decode->bytes_decompressed = uncompressed_size;
  return eVar1;
}

Assistant:

exr_result_t
internal_exr_undo_dwab (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size)
{
    exr_result_t  rv;
    DwaCompressor dwab;

    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        internal_exr_huf_decompress_spare_bytes ());
    if (rv == EXR_ERR_SUCCESS)
    {
        rv = DwaCompressor_construct (&dwab, STATIC_HUFFMAN, NULL, decode);
        if (rv == EXR_ERR_SUCCESS)
            rv = DwaCompressor_uncompress (
                &dwab,
                compressed_data,
                comp_buf_size,
                uncompressed_data,
                uncompressed_size);

        DwaCompressor_destroy (&dwab);
    }
    decode->bytes_decompressed = uncompressed_size;

    return rv;
}